

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-list.c
# Opt level: O0

void monster_list_format_section
               (monster_list_t *list,textblock *tb,monster_list_section_t section,
               wchar_t lines_to_display,wchar_t max_width,char *prefix,_Bool show_others,
               size_t *max_width_result)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  uint8_t attr;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  size_t local_1d8;
  size_t local_1c0;
  size_t local_1a0;
  char *direction2;
  char *direction1;
  uint16_t asleep_in_section;
  uint16_t count_in_section;
  size_t name_width;
  size_t full_width;
  char local_168 [7];
  uint8_t line_attr;
  char location [20];
  char local_148 [8];
  char asleep [20];
  size_t max_line_length;
  char *others;
  char *punctuation;
  char line_buffer [200];
  int local_40;
  wchar_t total;
  wchar_t index;
  wchar_t line_count;
  wchar_t remaining_monster_total;
  _Bool show_others_local;
  char *prefix_local;
  wchar_t max_width_local;
  wchar_t lines_to_display_local;
  monster_list_section_t section_local;
  textblock *tb_local;
  monster_list_t *list_local;
  
  index = L'\0';
  total = L'\0';
  pcVar5 = ":";
  if (lines_to_display == L'\0') {
    pcVar5 = ".";
  }
  pcVar6 = "";
  if (show_others) {
    pcVar6 = "other ";
  }
  stack0xfffffffffffffed0 = 0;
  if ((list != (monster_list_t *)0x0) && (list->entries != (monster_list_entry_t *)0x0)) {
    uVar1 = list->distinct_entries;
    if (list->total_monsters[section] == 0) {
      register0x00000000 = strnfmt((char *)&punctuation,200,"%s no monsters.\n",prefix);
      if (tb != (textblock *)0x0) {
        textblock_append(tb,"%s",&punctuation);
      }
      if (max_width_result != (size_t *)0x0) {
        if (stack0xfffffffffffffed0 < 0x28) {
          local_1a0 = 0x28;
        }
        else {
          local_1a0 = stack0xfffffffffffffed0;
        }
        *max_width_result = local_1a0;
      }
    }
    else {
      pcVar12 = "s";
      if (list->total_monsters[section] == 1) {
        pcVar12 = "";
      }
      register0x00000000 =
           strnfmt((char *)&punctuation,200,"%s %d %smonster%s%s\n",prefix,
                   (ulong)list->total_monsters[section],pcVar6,pcVar12,pcVar5);
      if (tb != (textblock *)0x0) {
        textblock_append(tb,"%s",&punctuation);
      }
      for (local_40 = 0; local_40 < (int)(uint)uVar1 && total < lines_to_display;
          local_40 = local_40 + 1) {
        memset(local_148,0,0x14);
        memset(local_168,0,0x14);
        punctuation._0_1_ = 0;
        if (list->entries[local_40].count[section] != 0) {
          if (list->entries[local_40].count[section] == 1) {
            pcVar5 = "S";
            if (list->entries[local_40].dy[section] < 1) {
              pcVar5 = "N";
            }
            pcVar6 = "E";
            if (list->entries[local_40].dx[section] < 1) {
              pcVar6 = "W";
            }
            uVar10 = (uint)list->entries[local_40].dy[section];
            if ((int)uVar10 < 1) {
              uVar10 = -uVar10;
            }
            uVar11 = (uint)list->entries[local_40].dx[section];
            if ((int)uVar11 < 1) {
              uVar11 = -uVar11;
            }
            strnfmt(local_168,0x14," %d %s %d %s",(ulong)uVar10,pcVar5,(ulong)uVar11,pcVar6);
          }
          sVar7 = utf8_strlen(local_168);
          lVar8 = ((long)(max_width + L'\xfffffffe') - sVar7) + -1;
          uVar2 = list->entries[local_40].asleep[section];
          uVar3 = list->entries[local_40].count[section];
          if ((uVar2 == 0) || (uVar3 < 2)) {
            if ((uVar2 == 1) && (uVar3 == 1)) {
              strnfmt(local_148,0x14," (asleep)");
            }
          }
          else {
            strnfmt(local_148,0x14," (%d asleep)",(ulong)uVar2);
          }
          sVar7 = utf8_strlen(local_148);
          if (lVar8 - sVar7 < 0xc9) {
            local_1c0 = utf8_strlen(local_148);
            local_1c0 = lVar8 - local_1c0;
          }
          else {
            local_1c0 = 200;
          }
          get_mon_name((char *)&punctuation,200,list->entries[local_40].race,
                       (uint)list->entries[local_40].count[section]);
          utf8_clipto((char *)&punctuation,local_1c0);
          my_strcat((char *)&punctuation,local_148,200);
          uVar4 = stack0xfffffffffffffed0;
          sVar7 = utf8_strlen((char *)&punctuation);
          if (uVar4 < sVar7 + 0xe) {
            local_1d8 = utf8_strlen((char *)&punctuation);
            local_1d8 = local_1d8 + 0xe;
          }
          else {
            local_1d8 = stack0xfffffffffffffed0;
          }
          stack0xfffffffffffffed0 = local_1d8;
          if (((tb != (textblock *)0x0) && (tile_width == '\x01')) && (tile_height == '\x01')) {
            textblock_append_pict
                      (tb,list->entries[local_40].attr,
                       monster_x_char[(list->entries[local_40].race)->ridx]);
            textblock_append(tb," ");
          }
          if (tb != (textblock *)0x0) {
            sVar9 = strlen((char *)&punctuation);
            sVar7 = utf8_strlen((char *)&punctuation);
            attr = monster_list_entry_line_color(list->entries + local_40);
            textblock_append_c(tb,attr,"%-*s%s\n",(sVar9 - sVar7) + lVar8,&punctuation,local_168);
          }
          total = total + L'\x01';
        }
      }
      if (max_width_result != (size_t *)0x0) {
        *max_width_result = stack0xfffffffffffffed0;
      }
      if ((L'\0' < lines_to_display) && (lines_to_display < (int)(uint)list->total_entries[section])
         ) {
        for (; local_40 < (int)(uint)uVar1; local_40 = local_40 + 1) {
          index = (uint)list->entries[local_40].count[section] + index;
        }
        if (tb != (textblock *)0x0) {
          textblock_append(tb,"%6s...and %d others.\n"," ",(ulong)(uint)index);
        }
      }
    }
  }
  return;
}

Assistant:

static void monster_list_format_section(const monster_list_t *list, textblock *tb, monster_list_section_t section, int lines_to_display, int max_width, const char *prefix, bool show_others, size_t *max_width_result)
{
	int remaining_monster_total = 0;
	int line_count = 0;
	int index;
	int total;
	char line_buffer[200];
	const char *punctuation = (lines_to_display == 0) ? "." : ":";
	const char *others = (show_others) ? "other " : "";
	size_t max_line_length = 0;

	if (list == NULL || list->entries == NULL)
		return;

	total = list->distinct_entries;

	if (list->total_monsters[section] == 0) {
		max_line_length = strnfmt(line_buffer, sizeof(line_buffer),
								  "%s no monsters.\n", prefix);

		if (tb != NULL)
			textblock_append(tb, "%s", line_buffer);

		/* Force a minimum width so that the prompt doesn't get cut off. */
		if (max_width_result != NULL)
			*max_width_result = MAX(max_line_length, 40);

		return;
	}

	max_line_length = strnfmt(line_buffer, sizeof(line_buffer),
							  "%s %d %smonster%s%s\n",
							  prefix,
							  list->total_monsters[section],
							  others,
							  PLURAL(list->total_monsters[section]),
							  punctuation);

	if (tb != NULL)
		textblock_append(tb, "%s", line_buffer);

	for (index = 0; index < total && line_count < lines_to_display; index++) {
		char asleep[20] = { '\0' };
		char location[20] = { '\0' };
		uint8_t line_attr;
		size_t full_width;
		size_t name_width;
		uint16_t count_in_section = 0;
		uint16_t asleep_in_section = 0;

		line_buffer[0] = '\0';

		if (list->entries[index].count[section] == 0)
			continue;

		/* Only display directions for the case of a single monster. */
		if (list->entries[index].count[section] == 1) {
			const char *direction1 =
				(list->entries[index].dy[section] <= 0)	? "N" : "S";
			const char *direction2 =
				(list->entries[index].dx[section] <= 0) ? "W" : "E";
			strnfmt(location, sizeof(location), " %d %s %d %s",
					abs(list->entries[index].dy[section]), direction1,
					abs(list->entries[index].dx[section]), direction2);
		}

		/* Get width available for monster name and sleep tag: 2 for char and
		 * space; location includes padding; last -1 for some reason? */
		full_width = max_width - 2 - utf8_strlen(location) - 1;

		asleep_in_section = list->entries[index].asleep[section];
		count_in_section = list->entries[index].count[section];

		if (asleep_in_section > 0 && count_in_section > 1)
			strnfmt(asleep, sizeof(asleep), " (%d asleep)", asleep_in_section);
		else if (asleep_in_section == 1 && count_in_section == 1)
			strnfmt(asleep, sizeof(asleep), " (asleep)");

		/* Clip the monster name to fit, and append the sleep tag. */
		name_width = MIN(full_width - utf8_strlen(asleep), sizeof(line_buffer));
		get_mon_name(line_buffer, sizeof(line_buffer),
					 list->entries[index].race,
					 list->entries[index].count[section]);
		utf8_clipto(line_buffer, name_width);
		my_strcat(line_buffer, asleep, sizeof(line_buffer));

		/* Calculate the width of the line for dynamic sizing; use a fixed max
		 * width for location and monster char. */
		max_line_length = MAX(max_line_length,
							  utf8_strlen(line_buffer) + 12 + 2);

		/* textblock_append_pict will safely add the monster symbol,
		 * regardless of ASCII/graphics mode. */
		if (tb != NULL && tile_width == 1 && tile_height == 1) {
			textblock_append_pict(tb, list->entries[index].attr, monster_x_char[list->entries[index].race->ridx]);
			textblock_append(tb, " ");
		}

		/* Add the left-aligned and padded monster name which will align the
		 * location to the right. */
		if (tb != NULL) {
			/* Hack - Because monster race strings are UTF8, we have to add
			 * additional padding for any raw bytes that might be consolidated
			 * into one displayed character. */
			full_width += strlen(line_buffer) - utf8_strlen(line_buffer);
			line_attr = monster_list_entry_line_color(&list->entries[index]);
			textblock_append_c(tb, line_attr, "%-*s%s\n",
				(int) full_width, line_buffer, location);
		}

		line_count++;
	}

	/* Don't worry about the "...others" line, since it's probably shorter
	 * than what's already printed. */
	if (max_width_result != NULL)
		*max_width_result = max_line_length;

	/* Bail since we don't have enough room to display the remaining count or
	 * since we've displayed them all. */
	if (lines_to_display <= 0 ||
		lines_to_display >= list->total_entries[section])
		return;

	/* Sum the remaining monsters; start where we left off in the above loop. */
	while (index < total) {
		remaining_monster_total += list->entries[index].count[section];
		index++;
	}

	if (tb != NULL)
		textblock_append(tb, "%6s...and %d others.\n", " ",
						 remaining_monster_total);
}